

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void setCmdOptionsAndRun(Carver *carver,int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Alloc_hider __nptr;
  Carver *pCVar2;
  int iVar3;
  char **ppcVar4;
  char *pcVar5;
  size_t sVar6;
  char *__s;
  float *pfVar7;
  CarveMode carveMode;
  int iVar8;
  uint uVar9;
  bool bVar10;
  float carveAmount;
  float fVar11;
  string filename;
  string carveModeStr;
  string outputStr;
  string local_228;
  float local_204;
  char **local_200;
  string local_1f8;
  string local_1d8;
  int local_1b4;
  char **local_1b0;
  Carver *local_1a8;
  char *local_1a0;
  pointer local_198;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110 [2];
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  paVar1 = &local_1f8.field_2;
  local_1f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"-h","");
  local_200 = argv + argc;
  ppcVar4 = std::__find_if<char**,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      (argv,local_200,&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if (ppcVar4 != local_200) {
    usage();
    exit(0);
  }
  local_1f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"-m","");
  pcVar5 = getCmdOption(argv,local_200,&local_1f8,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if (pcVar5 == (char *)0x0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Carve mode value missing","");
    terminate(1,&local_50);
  }
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  sVar6 = strlen(pcVar5);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,pcVar5,pcVar5 + sVar6);
  iVar3 = std::__cxx11::string::compare((char *)&local_1f8);
  if (iVar3 == 0) {
    carveMode = BOTH;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)&local_1f8);
    if (iVar3 == 0) {
      carveMode = VERTICAL;
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)&local_1f8);
      carveMode = HORIZONTAL;
      if (iVar3 != 0) {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,"Carve mode value invalid","");
        terminate(1,&local_70);
      }
    }
  }
  ::carver::Carver::setCarveMode(carver,carveMode);
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"-o","");
  pcVar5 = getCmdOption(argv,local_200,&local_1d8,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if (pcVar5 == (char *)0x0) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Output path missing","");
    terminate(1,&local_90);
  }
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  sVar6 = strlen(pcVar5);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,pcVar5,pcVar5 + sVar6);
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"-c","");
  pcVar5 = getCmdOption(argv,local_200,&local_228,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  local_1b4 = argc;
  local_1a8 = carver;
  if (pcVar5 == (char *)0x0) {
    iVar8 = 4;
    iVar3 = 0;
  }
  else {
    iVar3 = atoi(pcVar5);
    if (iVar3 == 0) {
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"Invalid argument for carve count","");
      terminate(1,&local_b0);
    }
    iVar8 = 6;
  }
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"-p","");
  local_1b0 = argv;
  __s = getCmdOption(argv,local_200,&local_228,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  fVar11 = 0.0;
  if (__s == (char *)0x0) {
    fVar11 = 0.15;
  }
  carveAmount = 0.0;
  if (iVar3 == 0) {
    carveAmount = fVar11;
  }
  if (__s == (char *)0x0) goto LAB_0010cdee;
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  local_1a0 = pcVar5;
  sVar6 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,__s,__s + sVar6);
  __nptr._M_p = local_228._M_dataplus._M_p;
  pfVar7 = (float *)__errno_location();
  local_204 = *pfVar7;
  *pfVar7 = 0.0;
  carveAmount = strtof(__nptr._M_p,&local_198);
  if (local_198 == __nptr._M_p) {
    std::__throw_invalid_argument("stof");
    goto LAB_0010d136;
  }
  if (*pfVar7 == 0.0) {
LAB_0010cda2:
    *pfVar7 = local_204;
  }
  else if (*pfVar7 == 4.76441e-44) {
    carveAmount = (float)std::__throw_out_of_range("stof");
    goto LAB_0010cda2;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    local_204 = carveAmount;
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    carveAmount = local_204;
  }
  if ((carveAmount == 0.0) && (!NAN(carveAmount))) {
LAB_0010d136:
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,"Invalid argument for carve amount","");
    terminate(1,&local_d0);
  }
  iVar8 = iVar8 + 2;
  pcVar5 = local_1a0;
LAB_0010cdee:
  pCVar2 = local_1a8;
  if (pcVar5 != (char *)0x0 && __s != (char *)0x0) {
    local_110[0]._M_dataplus._M_p = (pointer)&local_110[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_110,"Invalid combination of arguments -p and -c","");
    terminate(1,local_110);
  }
  ::carver::Carver::setCarveAmount(local_1a8,carveAmount);
  ppcVar4 = local_1b0;
  ::carver::Carver::setCarveCount(pCVar2,iVar3);
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"-v","");
  ppcVar4 = std::__find_if<char**,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      (ppcVar4,local_200,&local_228);
  pCVar2 = local_1a8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  bVar10 = ppcVar4 != local_200;
  ::carver::Carver::setVerbosity(pCVar2,bVar10);
  uVar9 = iVar8 + (uint)bVar10;
  if ((int)(uVar9 + 2) <= local_1b4) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_228,local_1b0[(ulong)uVar9 + 1],(allocator<char> *)&local_198);
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_170,local_228._M_dataplus._M_p,
               local_228._M_dataplus._M_p + local_228._M_string_length);
    bVar10 = ::carver::Carver::loadTargetImage(pCVar2,&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
    if (bVar10) {
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_190,local_1d8._M_dataplus._M_p,
                 local_1d8._M_dataplus._M_p + local_1d8._M_string_length);
      ::carver::Carver::carveImage(pCVar2,&local_190);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      return;
    }
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_150,"Image loading failed, please provide path as the last argument"
               ,"");
    terminate(1,&local_150);
  }
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"input path not provided","")
  ;
  terminate(1,&local_130);
}

Assistant:

void setCmdOptionsAndRun(carver::Carver &carver, int argc, char *argv[]) {

    int optionCount = 0;

    // Request for help
    if (cmdOptionExists(argv, argv+argc, "-h")) {
            usage();
            exit(0);
    }

    // Carve mode
    carver::CarveMode carveMode;
    char* carveModeOpt = getCmdOption(argv, argv+argc, "-m", true);
    if (!carveModeOpt)
        terminate(1, "Carve mode value missing");
    string carveModeStr(carveModeOpt);
    optionCount+=2;
    if (carveModeStr == "both")
        carveMode = carver::BOTH;
    else if (carveModeStr == "vertical")
        carveMode = carver::VERTICAL;
    else if (carveModeStr == "horizontal")
        carveMode = carver::HORIZONTAL;
    else
        terminate(1, "Carve mode value invalid");

    carver.setCarveMode(carveMode);

    // Output path
    char* outputOpt = getCmdOption(argv, argv+argc, "-o", true);
    if (!outputOpt)
        terminate(1, "Output path missing");
    string outputStr(outputOpt);
    optionCount+=2;

    // Carve amount, absolute count
    int carveCount = 0;
    char* carveCountOpt = getCmdOption(argv, argv+argc, "-c", false);
    if (carveCountOpt) {
        carveCount = atoi(carveCountOpt);
        optionCount+=2;
        if (carveCount == 0) {
            terminate(1, "Invalid argument for carve count");
        }
    }

    // Carve amount, proportional
    float carveAmount = 0.0f;
    char* carveAmountOpt = getCmdOption(argv, argv+argc, "-p", false);
    if (!carveAmountOpt && !carveCount) {
        carveAmount = 0.15f;
    } else if (carveAmountOpt) {
        try {
            carveAmount = stof(string(carveAmountOpt));
            optionCount+=2;
            if (carveAmount == 0.0f) {
                terminate(1, "Invalid argument for carve amount");
            }
        } catch (invalid_argument&) {
            terminate(1, "Invalid argument for carve amount");
        }
    }

    if (carveAmountOpt && carveCountOpt)
        terminate(1, "Invalid combination of arguments -p and -c");

    carver.setCarveAmount(carveAmount);
    carver.setCarveCount(carveCount);


    // Verbosity
    bool verbose = false;
    if(cmdOptionExists(argv, argv+argc, "-v")) {
        verbose = true;
        optionCount++;
    }
    carver.setVerbosity(verbose);

    // Load target image
    if (argc < optionCount + 2)
        terminate(1, "input path not provided");
    string filename = argv[optionCount + 1];

    if(!carver.loadTargetImage(filename)) {
        terminate(1, "Image loading failed, please provide path as the last argument");
    }

    carver.carveImage(outputStr);
}